

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

int op_get_more(lua_State *L)

{
  int off;
  lua_Integer lVar1;
  undefined1 local_d8 [4];
  int len;
  buffer buf;
  char *cursor_id;
  size_t cursor_len;
  char *pcStack_30;
  int number;
  char *name;
  size_t sz;
  lua_State *plStack_18;
  int id;
  lua_State *L_local;
  
  plStack_18 = L;
  lVar1 = luaL_checkinteger(L,1);
  sz._4_4_ = (int32_t)lVar1;
  name = (char *)0x0;
  pcStack_30 = luaL_checklstring(plStack_18,2,(size_t *)&name);
  lVar1 = luaL_checkinteger(plStack_18,3);
  cursor_len._4_4_ = (int32_t)lVar1;
  cursor_id = (char *)0x0;
  buf.buffer._120_8_ = luaL_tolstring(plStack_18,4,(size_t *)&cursor_id);
  if (cursor_id == (char *)0x8) {
    buffer_create((buffer *)local_d8);
    off = reserve_length((buffer *)local_d8);
    write_int32((buffer *)local_d8,sz._4_4_);
    write_int32((buffer *)local_d8,0);
    write_int32((buffer *)local_d8,0x7d5);
    write_int32((buffer *)local_d8,0);
    write_string((buffer *)local_d8,pcStack_30,(size_t)name);
    write_int32((buffer *)local_d8,cursor_len._4_4_);
    write_bytes((buffer *)local_d8,(void *)buf.buffer._120_8_,8);
    write_length((buffer *)local_d8,(int32_t)local_d8,off);
    lua_pushlstring(plStack_18,(char *)buf._0_8_,(long)(int)local_d8);
    buffer_destroy((buffer *)local_d8);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = luaL_error(plStack_18,"Invalid cursor id");
  }
  return L_local._4_4_;
}

Assistant:

static int
op_get_more(lua_State *L) {
	int id = luaL_checkinteger(L, 1);
	size_t sz = 0;
	const char * name = luaL_checklstring(L,2,&sz);
	int number = luaL_checkinteger(L, 3);
	size_t cursor_len = 0;
	const char * cursor_id = luaL_tolstring(L, 4, &cursor_len);
	if (cursor_len != 8) {
		return luaL_error(L, "Invalid cursor id");
	}

	struct buffer buf;
	buffer_create(&buf);
		int len = reserve_length(&buf);
		write_int32(&buf, id);
		write_int32(&buf, 0);
		write_int32(&buf, OP_GET_MORE);
		write_int32(&buf, 0);
		write_string(&buf, name, sz);
		write_int32(&buf, number);
		write_bytes(&buf, cursor_id, 8);
		write_length(&buf, buf.size, len);

		lua_pushlstring(L, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	return 1;
}